

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h
# Opt level: O1

void __thiscall
pzgeom::TPZNodeRep<1,_pztopology::TPZPoint>::Print
          (TPZNodeRep<1,_pztopology::TPZPoint> *this,ostream *out)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(out,"Nodeindices: ",0xd);
  poVar1 = std::ostream::_M_insert<long>((long)out);
  uStack_18 = CONCAT17(0x20,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return;
}

Assistant:

void Print(std::ostream &out) const
        {
            int nn;
            out << "Nodeindices: ";
            for(nn=0; nn<N; nn++)
            {
                out << fNodeIndexes[nn] << ' ';
            }
            out << std::endl;
        }